

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O2

char * Rml::LegalVariableName(String *name)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  size_type sVar4;
  char *pcVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  allocator_type local_129;
  key_compare local_128;
  allocator<char> local_127;
  allocator<char> local_126;
  allocator<char> local_125;
  allocator<char> local_124;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  String name_lower;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  String local_40;
  
  if ((LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&LegalVariableName(std::__cxx11::string_const&)::
                                   reserved_names_abi_cxx11_), iVar2 != 0)) {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&name_lower,"it",&local_121);
    ::std::__cxx11::string::string<std::allocator<char>>(local_100,"it_index",&local_122);
    ::std::__cxx11::string::string<std::allocator<char>>(local_e0,"ev",&local_123);
    ::std::__cxx11::string::string<std::allocator<char>>(local_c0,"true",&local_124);
    ::std::__cxx11::string::string<std::allocator<char>>(local_a0,"false",&local_125);
    ::std::__cxx11::string::string<std::allocator<char>>(local_80,"size",&local_126);
    ::std::__cxx11::string::string<std::allocator<char>>(local_60,"literal",&local_127);
    init._M_len = 7;
    init._M_array = &name_lower;
    itlib::
    flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::flat_set(&LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_,init,
               &local_128,&local_129);
    lVar6 = 0xc0;
    do {
      ::std::__cxx11::string::~string(local_100 + lVar6 + -0x20);
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x20);
    __cxa_atexit(itlib::
                 flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~flat_set,
                 &LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_);
  }
  if (name->_M_string_length == 0) {
    pcVar5 = "Name cannot be empty.";
  }
  else {
    ::std::__cxx11::string::string((string *)&local_40,(string *)name);
    StringUtilities::ToLower(&name_lower,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    if ((byte)(*name_lower._M_dataplus._M_p + 0x9fU) < 0x1a) {
      sVar4 = 0;
      pcVar5 = "Name must strictly contain characters a-z, A-Z, 0-9 and under_score.";
      do {
        if (name_lower._M_string_length == sVar4) {
          sVar3 = itlib::
                  flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ::count<std::__cxx11::string>
                            ((flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              *)&LegalVariableName(std::__cxx11::string_const&)::
                                 reserved_names_abi_cxx11_,&name_lower);
          pcVar5 = (char *)0x0;
          if (sVar3 == 1) {
            pcVar5 = "Name is reserved.";
          }
          break;
        }
        cVar1 = name_lower._M_dataplus._M_p[sVar4];
        sVar4 = sVar4 + 1;
      } while ((((byte)(cVar1 - 0x30U) < 10) || (cVar1 == '_')) || ((byte)(cVar1 + 0x9fU) < 0x1a));
    }
    else {
      pcVar5 = "First character must be \'a-z\' or \'A-Z\'.";
    }
    ::std::__cxx11::string::~string((string *)&name_lower);
  }
  return pcVar5;
}

Assistant:

static const char* LegalVariableName(const String& name)
{
	static SmallUnorderedSet<String> reserved_names{"it", "it_index", "ev", "true", "false", "size", "literal"};

	if (name.empty())
		return "Name cannot be empty.";

	const String name_lower = StringUtilities::ToLower(name);

	const char first = name_lower.front();
	if (!(first >= 'a' && first <= 'z'))
		return "First character must be 'a-z' or 'A-Z'.";

	for (const char c : name_lower)
	{
		if (!(c == '_' || (c >= 'a' && c <= 'z') || (c >= '0' && c <= '9')))
			return "Name must strictly contain characters a-z, A-Z, 0-9 and under_score.";
	}

	if (reserved_names.count(name_lower) == 1)
		return "Name is reserved.";

	return nullptr;
}